

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.c
# Opt level: O0

void Qiniu_Crypto_Init(void)

{
  OPENSSL_init_crypto(8,0);
  return;
}

Assistant:

void Qiniu_Crypto_Init() {
#if OPENSSL_VERSION_NUMBER < 0x30000000
	ENGINE_load_builtin_engines();
	ENGINE_register_all_complete();
#else
	OpenSSL_add_all_digests();
#endif
}